

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall SGParser::Generator::NFA::Or(NFA *this,NFA *b)

{
  NFANode *pNVar1;
  bool bVar2;
  pointer *this_00;
  reference ppNVar3;
  NFANode *fs_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  *__range3_1;
  NFANode *fs;
  iterator __end3;
  iterator __begin3;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_> *__range3;
  NFANode *pfinalState;
  NFANode *pnewStartState;
  NFA *b_local;
  NFA *this_local;
  
  if ((this != b) && ((this->pStartState != (NFANode *)0x0 || (b->pStartState != (NFANode *)0x0))))
  {
    pnewStartState = (NFANode *)b;
    b_local = this;
    pfinalState = NewState(this,0);
    __range3 = (vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                *)NewState(this,0);
    if (this->pStartState != (NFANode *)0x0) {
      AddLink(this,pfinalState,0,this->pStartState);
      __end3 = std::
               vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
               ::begin(&this->FinalState);
      fs = (NFANode *)
           std::
           vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
           end(&this->FinalState);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                                         *)&fs), bVar2) {
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                  ::operator*(&__end3);
        pNVar1 = *ppNVar3;
        AddLink(this,pNVar1,0,(NFANode *)__range3);
        pNVar1->AcceptingState = 0;
        __gnu_cxx::
        __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
        ::operator++(&__end3);
      }
      std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
      clear(&this->FinalState);
    }
    if ((pnewStartState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      AddLink(this,pfinalState,0,
              (NFANode *)
              (pnewStartState->LinkChar).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start);
      this_00 = &(pnewStartState->LinkChar).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      __end3_1 = std::
                 vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ::begin((vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                          *)this_00);
      fs_1 = (NFANode *)
             std::
             vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ::end((vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                    *)this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                                 *)&fs_1), bVar2) {
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                  ::operator*(&__end3_1);
        pNVar1 = *ppNVar3;
        AddLink(this,pNVar1,0,(NFANode *)__range3);
        pNVar1->AcceptingState = 0;
        __gnu_cxx::
        __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
        ::operator++(&__end3_1);
      }
      std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
      clear((vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             *)&(pnewStartState->LinkChar).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    }
    this->pStartState = pfinalState;
    *(uint *)((long)&(__range3->
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4) = this->LexemeId;
    std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
    push_back(&this->FinalState,(value_type *)&__range3);
    (pnewStartState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  return;
}

Assistant:

void NFA::Or(NFA& b) {
    // Same as us
    if (this == &b)
        return;
    if (!pStartState && !b.pStartState)
        return;

    const auto pnewStartState = NewState(0u);
    const auto pfinalState    = NewState(0u);

    // Connect the start state to the start states of this and b
    // with epsilon transitions
    if (pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

        // Connect all the final states of a and b to the new final state
        // Make the final states of a and b no longer final states
        for (const auto fs : FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        FinalState.clear();
    }
    if (b.pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, b.pStartState);

        for (const auto fs : b.FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        b.FinalState.clear();
    }

    // Set new start state
    pStartState = pnewStartState;
    // Make the state final
    pfinalState->AcceptingState = LexemeId;
    FinalState.push_back(pfinalState);

    // Release b's data
    b.pStartState = nullptr;
}